

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::mousePressEvent(QDateTimeEdit *this,QMouseEvent *event)

{
  bool bVar1;
  QDateTimeEditPrivate *pQVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QDateTimeEditPrivate *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  QDateTimeEditPrivate *d;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDateTimeEdit *)0x55f69f);
  bVar1 = QDateTimeEditPrivate::calendarPopupEnabled(in_RSI);
  if (bVar1) {
    QVar3 = QSinglePointEvent::position((QSinglePointEvent *)0x55f6d9);
    local_10 = QPointF::toPoint((QPointF *)in_RSI);
    __fd = (int)&local_10;
    QAbstractSpinBoxPrivate::updateHoverControl((QAbstractSpinBoxPrivate *)QVar3.xp,in_RDI);
    if ((pQVar2->super_QAbstractSpinBoxPrivate).hoverControl == SC_ComboBoxArrow) {
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,in_RCX);
      if ((*(ushort *)&(pQVar2->super_QAbstractSpinBoxPrivate).field_0x3d0 >> 1 & 1) == 0) {
        QDateTimeEditPrivate::updateArrow(in_RSI,(StateFlag)((ulong)pQVar2 >> 0x20));
        QDateTimeEditPrivate::initCalendarPopup
                  ((QDateTimeEditPrivate *)QVar3.yp,(QCalendarWidget *)QVar3.xp);
        QDateTimeEditPrivate::positionCalendarPopup((QDateTimeEditPrivate *)event);
        QWidget::show((QWidget *)in_RSI);
      }
    }
    else {
      QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)in_RDI,(QMouseEvent *)in_RSI);
    }
  }
  else {
    QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)in_RDI,(QMouseEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::mousePressEvent(QMouseEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::mousePressEvent(event);
        return;
    }
    d->updateHoverControl(event->position().toPoint());
    if (d->hoverControl == QStyle::SC_ComboBoxArrow) {
        event->accept();
        if (d->readOnly) {
            return;
        }
        d->updateArrow(QStyle::State_Sunken);
        d->initCalendarPopup();
        d->positionCalendarPopup();
        //Show the calendar
        d->monthCalendar->show();
    } else {
        QAbstractSpinBox::mousePressEvent(event);
    }
}